

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_start_new_doc(Parser *this,csubstr rem)

{
  pfn_error p_Var1;
  size_t sVar2;
  code *pcVar3;
  Location LVar4;
  bool bVar5;
  ro_substr pattern;
  csubstr cVar6;
  char *pcStack_58;
  size_t local_50;
  char msg [39];
  csubstr rem_local;
  
  rem_local.len = rem.len;
  rem_local.str = rem.str;
  pattern.len = 3;
  pattern.str = "---";
  bVar5 = basic_substring<const_char>::begins_with(&rem_local,pattern);
  if (!bVar5) {
    builtin_strncpy(msg,"check failed: (rem.begins_with(\"---\"))",0x27);
    if (((byte)s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar6 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_50 = cVar6.len;
    pcStack_58 = cVar6.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x77fc) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x77fc) << 0x40,8);
    LVar4.name.str = pcStack_58;
    LVar4.name.len = local_50;
    (*p_Var1)(msg,0x27,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  _end_stream(this);
  sVar2 = this->m_state->indref;
  _line_progressed(this,3);
  _push_level(this,false);
  _start_doc(this,true);
  this->m_state->indref = sVar2;
  return;
}

Assistant:

void Parser::_start_new_doc(csubstr rem)
{
    _c4dbgp("_start_new_doc");
    _RYML_CB_ASSERT(m_stack.m_callbacks, rem.begins_with("---"));
    C4_UNUSED(rem);

    _end_stream();

    size_t indref = m_state->indref;
    _c4dbgpf("start a document, indentation={}", indref);
    _line_progressed(3);
    _push_level();
    _start_doc();
    _set_indentation(indref);
}